

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.hpp
# Opt level: O2

number_validator<float> __thiscall
goodform::number_validator<float>::gte(number_validator<float> *this,float greater_or_equal_to)

{
  error_message *peVar1;
  long *in_RSI;
  undefined4 in_XMM0_Db;
  undefined8 uVar2;
  float fVar3;
  number_validator<float> nVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  error_message local_38;
  
  uVar2 = CONCAT44(in_XMM0_Db,greater_or_equal_to);
  fVar3 = *(float *)(in_RSI + 1);
  peVar1 = (error_message *)*in_RSI;
  if ((fVar3 < greater_or_equal_to) && ((peVar1->message_)._M_string_length == 0)) {
    std::__cxx11::to_string(&local_58,greater_or_equal_to);
    std::operator+(&bStack_78,"VALUE MUST BE GREATER THAN OR EQUAL TO ",&local_58);
    error_message::error_message(&local_38,&bStack_78);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_78);
    uVar2 = std::__cxx11::string::~string((string *)&local_58);
    peVar1 = (error_message *)*in_RSI;
    fVar3 = *(float *)(in_RSI + 1);
  }
  this->error_ = peVar1;
  this->value_ = fVar3;
  nVar4._8_8_ = uVar2;
  nVar4.error_ = (error_message *)this;
  return nVar4;
}

Assistant:

number_validator<N> number_validator<N>::gte(N greater_or_equal_to)
  {
    if (this->value_ < greater_or_equal_to && this->error_.empty())
      this->error_ = "VALUE MUST BE GREATER THAN OR EQUAL TO " + std::to_string(greater_or_equal_to);
    number_validator<N> ret(*this);
    return ret;
  }